

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

Stmt * __thiscall sqlite::Connection::Stmt::operator=(Stmt *this,Stmt *other)

{
  sqlite3 *psVar1;
  
  if (other != this) {
    sqlite3_finalize(this->stmt_);
    psVar1 = other->db_;
    this->stmt_ = other->stmt_;
    this->db_ = psVar1;
    other->stmt_ = (sqlite3_stmt *)0x0;
  }
  return this;
}

Assistant:

Connection::Stmt & Connection::Stmt::operator=(Connection::Stmt && other)
    {
        if(&other != this)
        {
            sqlite3_finalize(stmt_);
            stmt_ = other.stmt_;
            db_ = other.db_;
            other.stmt_ = nullptr;
        }
        return *this;
    }